

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O0

int ForcingStepReInit(void *arkode_mem,SUNStepper stepper1,SUNStepper stepper2,sunrealtype t0,
                     N_Vector y0)

{
  undefined8 in_RCX;
  SUNStepper in_RDX;
  ARKodeMem in_RSI;
  N_Vector in_XMM0_Qa;
  int retval;
  ARKodeForcingStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  SUNStepper stepper1_00;
  ARKodeMem ark_mem_00;
  int init_type;
  uint local_4;
  
  init_type = (int)((ulong)in_RCX >> 0x20);
  ark_mem_00 = (ARKodeMem)0x0;
  stepper1_00 = (SUNStepper)0x0;
  local_4 = forcingStep_AccessARKODEStepMem
                      ((void *)0x0,(char *)0x0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (ARKodeForcingStepMem *)0x154c0b);
  if (local_4 == 0) {
    if (ark_mem_00->MallocDone == 0) {
      arkProcessError(ark_mem_00,-0x17,0x20a,"ForcingStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                      ,"Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else {
      local_4 = forcingStep_CheckArgs
                          (ark_mem_00,stepper1_00,(SUNStepper)(ulong)in_stack_ffffffffffffffb8,
                           (N_Vector)0x154c82);
      if (local_4 == 0) {
        forcingStep_InitStepMem((ARKodeForcingStepMem)stepper1_00,(SUNStepper)in_RSI,in_RDX);
        local_4 = arkInit(in_RSI,(sunrealtype)in_RDX,in_XMM0_Qa,init_type);
        if (local_4 == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(ark_mem_00,(int)(ulong)local_4,0x218,"ForcingStepReInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                          ,"Unable to initialize main ARKODE infrastructure");
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ForcingStepReInit(void* arkode_mem, SUNStepper stepper1,
                      SUNStepper stepper2, sunrealtype t0, N_Vector y0)
{
  ARKodeMem ark_mem             = NULL;
  ARKodeForcingStepMem step_mem = NULL;

  int retval = forcingStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                               &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return ARK_NO_MALLOC;
  }

  retval = forcingStep_CheckArgs(ark_mem, stepper1, stepper2, y0);
  if (retval != ARK_SUCCESS) { return retval; }

  forcingStep_InitStepMem(step_mem, stepper1, stepper2);

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    return retval;
  }

  return ARK_SUCCESS;
}